

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O3

QString * escapeDir(QString *__return_storage_ptr__,QString *dir)

{
  Data *pDVar1;
  char cVar2;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char> local_28;
  QString *local_18;
  
  local_18 = *(QString **)(in_FS_OFFSET + 0x28);
  cVar2 = QString::endsWith((QChar)(char16_t)dir,0x5c);
  if (cVar2 == '\0') {
    pDVar1 = (dir->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (dir->d).ptr;
    (__return_storage_ptr__->d).size = (dir->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_28.b = '\\';
    local_28.a = dir;
    QStringBuilder<const_QString_&,_char>::convertTo<QString>(__return_storage_ptr__,&local_28);
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString escapeDir(const QString &dir)
{
    // When building on non-MSys MinGW, the path ends with a backslash, which
    // GNU make will interpret that as a line continuation. Doubling the backslash
    // avoids the problem, at the cost of the variable containing *both* backslashes.
    if (dir.endsWith('\\'))
        return dir + '\\';
    return dir;
}